

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

void BN_consttime_swap(unsigned_long condition,BIGNUM *a,BIGNUM *b,int nwords)

{
  unsigned_long *puVar1;
  ulong *puVar2;
  long lVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar6 = 0xffffffffffffffff - ((long)(condition - 1) >> 0x3f);
  uVar7 = (uint)uVar6 & (b->top ^ a->top);
  a->top = a->top ^ uVar7;
  b->top = b->top ^ uVar7;
  switch(nwords) {
  case 1:
    puVar2 = a->d;
    puVar4 = b->d;
    goto LAB_0011229e;
  case 2:
    puVar2 = a->d;
    puVar4 = b->d;
    goto LAB_00112285;
  case 3:
    puVar2 = a->d;
    puVar4 = b->d;
    goto LAB_0011226c;
  case 4:
    puVar2 = a->d;
    puVar4 = b->d;
    goto LAB_00112253;
  case 5:
    puVar2 = a->d;
    puVar4 = b->d;
    goto LAB_0011223a;
  case 6:
    puVar2 = a->d;
    puVar4 = b->d;
    goto LAB_00112221;
  case 7:
    puVar2 = a->d;
    puVar4 = b->d;
    goto LAB_00112208;
  case 8:
    puVar2 = a->d;
    puVar4 = b->d;
    goto LAB_001121ef;
  case 9:
    puVar2 = a->d;
    puVar4 = b->d;
    break;
  default:
    for (lVar3 = 10; lVar3 < nwords; lVar3 = lVar3 + 1) {
      uVar5 = a->d[lVar3];
      puVar1 = b->d;
      uVar8 = (puVar1[lVar3] ^ uVar5) & uVar6;
      a->d[lVar3] = uVar5 ^ uVar8;
      puVar2 = puVar1 + lVar3;
      *puVar2 = *puVar2 ^ uVar8;
    }
  case 10:
    puVar2 = a->d;
    puVar4 = b->d;
    uVar5 = (puVar4[9] ^ puVar2[9]) & uVar6;
    puVar2[9] = puVar2[9] ^ uVar5;
    puVar4[9] = puVar4[9] ^ uVar5;
  }
  uVar5 = (puVar4[8] ^ puVar2[8]) & uVar6;
  puVar2[8] = puVar2[8] ^ uVar5;
  puVar4[8] = puVar4[8] ^ uVar5;
LAB_001121ef:
  uVar5 = (puVar4[7] ^ puVar2[7]) & uVar6;
  puVar2[7] = puVar2[7] ^ uVar5;
  puVar4[7] = puVar4[7] ^ uVar5;
LAB_00112208:
  uVar5 = (puVar4[6] ^ puVar2[6]) & uVar6;
  puVar2[6] = puVar2[6] ^ uVar5;
  puVar4[6] = puVar4[6] ^ uVar5;
LAB_00112221:
  uVar5 = (puVar4[5] ^ puVar2[5]) & uVar6;
  puVar2[5] = puVar2[5] ^ uVar5;
  puVar4[5] = puVar4[5] ^ uVar5;
LAB_0011223a:
  uVar5 = (puVar4[4] ^ puVar2[4]) & uVar6;
  puVar2[4] = puVar2[4] ^ uVar5;
  puVar4[4] = puVar4[4] ^ uVar5;
LAB_00112253:
  uVar5 = (puVar4[3] ^ puVar2[3]) & uVar6;
  puVar2[3] = puVar2[3] ^ uVar5;
  puVar4[3] = puVar4[3] ^ uVar5;
LAB_0011226c:
  uVar5 = (puVar4[2] ^ puVar2[2]) & uVar6;
  puVar2[2] = puVar2[2] ^ uVar5;
  puVar4[2] = puVar4[2] ^ uVar5;
LAB_00112285:
  uVar5 = (puVar4[1] ^ puVar2[1]) & uVar6;
  puVar2[1] = puVar2[1] ^ uVar5;
  puVar4[1] = puVar4[1] ^ uVar5;
LAB_0011229e:
  uVar6 = (*puVar4 ^ *puVar2) & uVar6;
  *puVar2 = *puVar2 ^ uVar6;
  *puVar4 = *puVar4 ^ uVar6;
  return;
}

Assistant:

void BN_consttime_swap(BN_ULONG condition, BIGNUM *a, BIGNUM *b, int nwords)
{
    BN_ULONG t;
    int i;

    bn_wcheck_size(a, nwords);
    bn_wcheck_size(b, nwords);

    assert(a != b);
    assert((condition & (condition - 1)) == 0);
    assert(sizeof(BN_ULONG) >= sizeof(int));

    condition = ((condition - 1) >> (BN_BITS2 - 1)) - 1;

    t = (a->top ^ b->top) & condition;
    a->top ^= t;
    b->top ^= t;

#define BN_CONSTTIME_SWAP(ind) \
        do { \
                t = (a->d[ind] ^ b->d[ind]) & condition; \
                a->d[ind] ^= t; \
                b->d[ind] ^= t; \
        } while (0)

    switch (nwords) {
    default:
        for (i = 10; i < nwords; i++)
            BN_CONSTTIME_SWAP(i);
        /* Fallthrough */
    case 10:
        BN_CONSTTIME_SWAP(9);   /* Fallthrough */
    case 9:
        BN_CONSTTIME_SWAP(8);   /* Fallthrough */
    case 8:
        BN_CONSTTIME_SWAP(7);   /* Fallthrough */
    case 7:
        BN_CONSTTIME_SWAP(6);   /* Fallthrough */
    case 6:
        BN_CONSTTIME_SWAP(5);   /* Fallthrough */
    case 5:
        BN_CONSTTIME_SWAP(4);   /* Fallthrough */
    case 4:
        BN_CONSTTIME_SWAP(3);   /* Fallthrough */
    case 3:
        BN_CONSTTIME_SWAP(2);   /* Fallthrough */
    case 2:
        BN_CONSTTIME_SWAP(1);   /* Fallthrough */
    case 1:
        BN_CONSTTIME_SWAP(0);
    }
#undef BN_CONSTTIME_SWAP
}